

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawUtil.cpp
# Opt level: O0

void __thiscall
vkt::drawutil::VulkanDrawContext::VulkanDrawContext
          (VulkanDrawContext *this,Context *context,DrawState *drawState,DrawCallData *drawCallData,
          VulkanProgram *vulkanProgram)

{
  VkCommandBuffer_s *pVVar1;
  deUint64 dVar2;
  PtrData<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_> data;
  PtrData<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_> data_00;
  PtrData<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_> data_01;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  RefData<vk::Handle<(vk::HandleType)24>_> data_02;
  RefData<vk::VkCommandBuffer_s_*> data_03;
  RefData<vk::Handle<(vk::HandleType)13>_> data_04;
  RefData<vk::Handle<(vk::HandleType)16>_> data_05;
  RefData<vk::Handle<(vk::HandleType)17>_> data_06;
  RefData<vk::Handle<(vk::HandleType)23>_> data_07;
  RefData<vk::Handle<(vk::HandleType)14>_> data_08;
  RefData<vk::Handle<(vk::HandleType)18>_> data_09;
  deUint32 queueFamilyIndex;
  uint uVar3;
  uint uVar4;
  int iVar5;
  DeviceInterface *vk_00;
  VkDevice device_00;
  Allocator *allocator_00;
  Handle<(vk::HandleType)24> *pHVar6;
  ImageWithMemory *pIVar7;
  VkImage *pVVar8;
  BufferWithMemory *pBVar9;
  void *pvVar10;
  VkDeviceSize VVar11;
  size_type sVar12;
  const_reference src;
  Handle<(vk::HandleType)13> *pHVar13;
  Handle<(vk::HandleType)17> *pHVar14;
  const_reference pvVar15;
  Handle<(vk::HandleType)14> *pHVar16;
  Handle<(vk::HandleType)16> *pHVar17;
  VkCommandBuffer_s **ppVVar18;
  Handle<(vk::HandleType)23> *pHVar19;
  Handle<(vk::HandleType)18> *pHVar20;
  VkBuffer *pVVar21;
  ulong uVar22;
  VkExtent3D VVar23;
  VkClearValue VVar24;
  VkImageSubresourceLayers subresourceLayers;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  VkPipelineInputAssemblyStateCreateInfo *local_ca8;
  Move<vk::Handle<(vk::HandleType)14>_> *local_a88;
  undefined1 local_a28 [8];
  VkBufferMemoryBarrier barrier_1;
  undefined1 local_9a0 [8];
  VkBufferImageCopy copyRegion;
  undefined1 local_948 [8];
  VkImageMemoryBarrier barrier;
  undefined4 local_8f8 [2];
  VkRenderPassBeginInfo renderPassBeginInfo;
  VkRect2D renderArea;
  VkClearDepthStencilValue local_898;
  VkClearValue clearValue;
  VkDeviceSize zeroOffset;
  Move<vk::Handle<(vk::HandleType)18>_> local_878;
  RefData<vk::Handle<(vk::HandleType)18>_> local_858;
  undefined1 local_838 [8];
  VkGraphicsPipelineCreateInfo graphicsPipelineInfo;
  undefined1 local_7a0 [7];
  bool tessellationEnabled;
  VkPipelineShaderStageCreateInfo pipelineShaderStageInfo;
  RefData<vk::Handle<(vk::HandleType)14>_> local_750;
  uint local_730;
  VkShaderStageFlagBits local_72c;
  deUint32 shaderNdx;
  VkShaderStageFlags stageFlags;
  vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  shaderStages;
  VkPipelineColorBlendStateCreateInfo pipelineColorBlendStateInfo;
  VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState;
  VkColorComponentFlags colorComponentsAll;
  VkPipelineDepthStencilStateCreateInfo pipelineDepthStencilStateInfo;
  deUint32 dStack_640;
  VkStencilOpState stencilOpState;
  VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo;
  VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo;
  VkPipelineViewportStateCreateInfo pipelineViewportStateInfo;
  VkRect2D scissor;
  VkViewport viewport;
  VkPipelineTessellationStateCreateInfo pipelineTessellationStateInfo;
  VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo;
  VkPipelineVertexInputStateCreateInfo vertexInputStateInfo;
  VkVertexInputAttributeDescription attributeDesc;
  undefined8 local_4e0;
  VkVertexInputBindingDescription bindingDesc;
  VkFormat vertexFormat;
  deUint32 vertexStride;
  RefData<vk::Handle<(vk::HandleType)23>_> local_4a8;
  undefined1 local_488 [8];
  VkFramebufferCreateInfo framebufferInfo;
  VkImageView attachmentBindInfos [1];
  RefData<vk::Handle<(vk::HandleType)17>_> local_420;
  undefined1 local_400 [8];
  VkRenderPassCreateInfo renderPassInfo;
  VkSubpassDescription subpassDescription;
  VkAttachmentReference depthAttachmentReference;
  VkAttachmentReference colorAttachmentReference;
  VkAttachmentDescription colorAttachmentDescription;
  RefData<vk::Handle<(vk::HandleType)16>_> local_320;
  VkDeviceMemory local_300;
  Allocation *local_2f8;
  Allocation *alloc_1;
  VkBufferCreateInfo local_2e8;
  PtrData<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_> local_2b0;
  PtrData<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_> *local_2a0;
  VkDeviceSize local_290;
  VkDeviceSize bufferSize;
  Allocation *local_280;
  Allocation *alloc;
  VkBufferCreateInfo local_270;
  PtrData<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_> local_238;
  PtrData<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_> *local_228;
  TextureFormat local_218;
  VkDeviceSize local_210;
  VkDeviceSize bitmapSize;
  undefined1 auStack_200 [24];
  Move<vk::Handle<(vk::HandleType)13>_> local_1e8;
  RefData<vk::Handle<(vk::HandleType)13>_> local_1c8;
  DefaultDeleter<vk::ImageWithMemory> local_1a5;
  deUint32 local_1a4;
  PtrData<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_> local_1a0;
  PtrData<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_> *local_190;
  VkExtent3D local_180;
  undefined1 local_170 [8];
  VkImageCreateInfo imageCreateInfo;
  VkImageSubresourceRange VStack_110;
  VkImageUsageFlags usage;
  Move<vk::VkCommandBuffer_s_*> local_f8;
  RefData<vk::VkCommandBuffer_s_*> local_d8;
  Move<vk::Handle<(vk::HandleType)24>_> local_b8;
  RefData<vk::Handle<(vk::HandleType)24>_> local_98;
  VkDeviceSize VStack_78;
  VkImageSubresourceRange colorSubresourceRange;
  Allocator *allocator;
  VkDevice device;
  DeviceInterface *vk;
  VulkanProgram *vulkanProgram_local;
  DrawCallData *drawCallData_local;
  DrawState *drawState_local;
  Context *context_local;
  VulkanDrawContext *this_local;
  
  DrawContext::DrawContext(&this->super_DrawContext,drawState,drawCallData);
  (this->super_DrawContext)._vptr_DrawContext = (_func_int **)&PTR__VulkanDrawContext_0165ad60;
  this->m_context = context;
  (this->m_program).shaders = vulkanProgram->shaders;
  de::details::MovePtr<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_>::MovePtr
            (&this->m_colorImage);
  de::details::MovePtr<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>::MovePtr
            (&this->m_colorAttachmentBuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_colorImageView);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::Move(&this->m_renderPass);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::Move(&this->m_framebuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::Move(&this->m_pipelineLayout);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::Move(&this->m_pipeline);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::Move(&this->m_cmdPool);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::Move(&this->m_cmdBuffer);
  local_a88 = this->m_shaderModules;
  do {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::Move(local_a88);
    local_a88 = local_a88 + 1;
  } while (local_a88 != (Move<vk::Handle<(vk::HandleType)14>_> *)&this->m_vertexBuffer);
  de::details::MovePtr<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>::MovePtr
            (&this->m_vertexBuffer);
  vk_00 = Context::getDeviceInterface(this->m_context);
  device_00 = Context::getDevice(this->m_context);
  allocator_00 = Context::getDefaultAllocator(this->m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(this->m_context);
  makeCommandPool(&local_b8,vk_00,device_00,queueFamilyIndex);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_98,(Move *)&local_b8);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_98.deleter.m_deviceIface;
  data_02.object.m_internal = local_98.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_98.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device._0_4_ = (int)local_98.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_98.deleter.m_device >> 0x20);
  data_02.deleter.m_allocator._0_4_ = (int)local_98.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_98.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::operator=(&this->m_cmdPool,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_b8);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     (&(this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  makeCommandBuffer(&local_f8,vk_00,device_00,(VkCommandPool)pHVar6->m_internal);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_d8,(Move *)&local_f8);
  uVar25 = SUB84(local_d8.object,0);
  uVar26 = (undefined4)((ulong)local_d8.object >> 0x20);
  uVar27 = SUB84(local_d8.deleter.m_deviceIface,0);
  uVar28 = (undefined4)((ulong)local_d8.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_deviceIface._0_4_ = uVar27;
  data_03.object = local_d8.object;
  data_03.deleter.m_deviceIface._4_4_ = uVar28;
  data_03.deleter.m_device._0_4_ = (int)local_d8.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_d8.deleter.m_device >> 0x20);
  data_03.deleter.m_pool.m_internal._0_4_ = (int)local_d8.deleter.m_pool.m_internal;
  data_03.deleter.m_pool.m_internal._4_4_ = (int)(local_d8.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::operator=(&this->m_cmdBuffer,data_03);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_f8);
  ::vk::makeImageSubresourceRange
            ((VkImageSubresourceRange *)&imageCreateInfo.initialLayout,1,0,1,0,1);
  colorSubresourceRange.levelCount = VStack_110.levelCount;
  VStack_78 = imageCreateInfo._80_8_;
  colorSubresourceRange._0_8_ = VStack_110._0_8_;
  local_170._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  imageCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageCreateInfo._4_4_ = 0;
  imageCreateInfo.pNext._0_4_ = 0;
  imageCreateInfo.pNext._4_4_ = 1;
  imageCreateInfo.flags = (this->super_DrawContext).m_drawState.colorFormat;
  uVar3 = tcu::Vector<unsigned_int,_2>::x(&(this->super_DrawContext).m_drawState.renderSize);
  uVar4 = tcu::Vector<unsigned_int,_2>::y(&(this->super_DrawContext).m_drawState.renderSize);
  VVar23 = ::vk::makeExtent3D(uVar3,uVar4,1);
  imageCreateInfo.extent.width = VVar23.depth;
  local_180._0_8_ = VVar23._0_8_;
  imageCreateInfo.imageType = local_180.width;
  imageCreateInfo.format = local_180.height;
  imageCreateInfo.extent.height = 1;
  imageCreateInfo.extent.depth = 1;
  imageCreateInfo.mipLevels = 1;
  imageCreateInfo.arrayLayers = 0;
  imageCreateInfo.samples = VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_1_BIT;
  imageCreateInfo.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageCreateInfo.usage = 0xffffffff;
  imageCreateInfo.queueFamilyIndexCount = 0;
  imageCreateInfo._68_4_ = 0;
  imageCreateInfo.pQueueFamilyIndices._0_4_ = 0;
  local_180 = VVar23;
  pIVar7 = (ImageWithMemory *)operator_new(0x30);
  local_1a4 = ::vk::MemoryRequirement::Any.m_flags;
  ::vk::ImageWithMemory::ImageWithMemory
            (pIVar7,vk_00,device_00,allocator_00,(VkImageCreateInfo *)local_170,
             ::vk::MemoryRequirement::Any);
  de::DefaultDeleter<vk::ImageWithMemory>::DefaultDeleter(&local_1a5);
  de::details::MovePtr<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_>::MovePtr
            ((MovePtr<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_> *)&local_1a0);
  local_190 = de::details::MovePtr::operator_cast_to_PtrData(&local_1a0,(MovePtr *)pIVar7);
  data.ptr._4_4_ = uVar26;
  data.ptr._0_4_ = uVar25;
  data._8_4_ = uVar27;
  data._12_4_ = uVar28;
  de::details::MovePtr<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_>::operator=
            (&this->m_colorImage,data);
  de::details::MovePtr<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_>::~MovePtr
            ((MovePtr<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_> *)&local_1a0);
  pIVar7 = de::details::UniqueBase<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_>::
           operator*(&(this->m_colorImage).
                      super_UniqueBase<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_>
                    );
  pVVar8 = ::vk::ImageWithMemory::operator*(pIVar7);
  auStack_200._16_8_ = pVVar8->m_internal;
  auStack_200._8_4_ = colorSubresourceRange.levelCount;
  bitmapSize = VStack_78;
  auStack_200._0_4_ = colorSubresourceRange.aspectMask;
  auStack_200._4_4_ = colorSubresourceRange.baseMipLevel;
  subresourceRange.levelCount = colorSubresourceRange.aspectMask;
  subresourceRange.aspectMask = (undefined4)VStack_78;
  subresourceRange.baseMipLevel = VStack_78._4_4_;
  subresourceRange.baseArrayLayer = colorSubresourceRange.baseMipLevel;
  subresourceRange.layerCount = colorSubresourceRange.levelCount;
  makeImageView(&local_1e8,vk_00,device_00,(VkImage)auStack_200._16_8_,VK_IMAGE_VIEW_TYPE_2D,
                (this->super_DrawContext).m_drawState.colorFormat,subresourceRange);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1c8,(Move *)&local_1e8);
  uVar25 = (undefined4)local_1c8.object.m_internal;
  uVar26 = (undefined4)(local_1c8.object.m_internal >> 0x20);
  uVar27 = SUB84(local_1c8.deleter.m_deviceIface,0);
  uVar28 = (undefined4)((ulong)local_1c8.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_deviceIface._0_4_ = uVar27;
  data_04.object.m_internal = local_1c8.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = uVar28;
  data_04.deleter.m_device._0_4_ = (int)local_1c8.deleter.m_device;
  data_04.deleter.m_device._4_4_ = (int)((ulong)local_1c8.deleter.m_device >> 0x20);
  data_04.deleter.m_allocator._0_4_ = (int)local_1c8.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_1c8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::operator=
            (&this->m_colorImageView,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_1e8);
  local_218 = ::vk::mapVkFormat((this->super_DrawContext).m_drawState.colorFormat);
  iVar5 = tcu::getPixelSize(local_218);
  uVar3 = tcu::Vector<unsigned_int,_2>::x(&(this->super_DrawContext).m_drawState.renderSize);
  uVar4 = tcu::Vector<unsigned_int,_2>::y(&(this->super_DrawContext).m_drawState.renderSize);
  local_210 = (VkDeviceSize)(iVar5 * uVar3 * uVar4);
  pBVar9 = (BufferWithMemory *)operator_new(0x30);
  makeBufferCreateInfo(&local_270,local_210,2);
  alloc._4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  ::vk::BufferWithMemory::BufferWithMemory
            (pBVar9,vk_00,device_00,allocator_00,&local_270,::vk::MemoryRequirement::HostVisible);
  de::DefaultDeleter<vk::BufferWithMemory>::DefaultDeleter
            ((DefaultDeleter<vk::BufferWithMemory> *)((long)&alloc + 3));
  de::details::MovePtr<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>::MovePtr
            ((MovePtr<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_> *)&local_238)
  ;
  local_228 = de::details::MovePtr::operator_cast_to_PtrData(&local_238,(MovePtr *)pBVar9);
  data_00.ptr._4_4_ = uVar26;
  data_00.ptr._0_4_ = uVar25;
  data_00._8_4_ = uVar27;
  data_00._12_4_ = uVar28;
  de::details::MovePtr<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>::operator=
            (&this->m_colorAttachmentBuffer,data_00);
  de::details::MovePtr<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>::~MovePtr
            ((MovePtr<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_> *)&local_238)
  ;
  pBVar9 = de::details::UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>
           ::operator->(&(this->m_colorAttachmentBuffer).
                         super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>
                       );
  local_280 = ::vk::BufferWithMemory::getAllocation(pBVar9);
  pvVar10 = ::vk::Allocation::getHostPtr(local_280);
  ::deMemset(pvVar10,0,local_210);
  bufferSize = (VkDeviceSize)::vk::Allocation::getMemory(local_280);
  VVar11 = ::vk::Allocation::getOffset(local_280);
  ::vk::flushMappedMemoryRange(vk_00,device_00,(VkDeviceMemory)bufferSize,VVar11,local_210);
  sVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                     ((this->super_DrawContext).m_drawCallData.vertices);
  local_290 = sVar12 << 4;
  pBVar9 = (BufferWithMemory *)operator_new(0x30);
  makeBufferCreateInfo(&local_2e8,local_290,0x80);
  alloc_1._4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  ::vk::BufferWithMemory::BufferWithMemory
            (pBVar9,vk_00,device_00,allocator_00,&local_2e8,::vk::MemoryRequirement::HostVisible);
  de::DefaultDeleter<vk::BufferWithMemory>::DefaultDeleter
            ((DefaultDeleter<vk::BufferWithMemory> *)((long)&alloc_1 + 3));
  de::details::MovePtr<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>::MovePtr
            ((MovePtr<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_> *)&local_2b0)
  ;
  local_2a0 = de::details::MovePtr::operator_cast_to_PtrData(&local_2b0,(MovePtr *)pBVar9);
  data_01.ptr._4_4_ = uVar26;
  data_01.ptr._0_4_ = uVar25;
  data_01._8_4_ = uVar27;
  data_01._12_4_ = uVar28;
  de::details::MovePtr<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>::operator=
            (&this->m_vertexBuffer,data_01);
  de::details::MovePtr<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>::~MovePtr
            ((MovePtr<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_> *)&local_2b0)
  ;
  pBVar9 = de::details::UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>
           ::operator->(&(this->m_vertexBuffer).
                         super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>
                       );
  local_2f8 = ::vk::BufferWithMemory::getAllocation(pBVar9);
  pvVar10 = ::vk::Allocation::getHostPtr(local_2f8);
  src = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                  ((this->super_DrawContext).m_drawCallData.vertices,0);
  ::deMemcpy(pvVar10,src,local_290);
  local_300 = ::vk::Allocation::getMemory(local_2f8);
  VVar11 = ::vk::Allocation::getOffset(local_2f8);
  ::vk::flushMappedMemoryRange(vk_00,device_00,local_300,VVar11,local_290);
  makePipelineLayoutWithoutDescriptors
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&colorAttachmentDescription.initialLayout,
             vk_00,device_00);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_320,(Move *)&colorAttachmentDescription.initialLayout);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_320.deleter.m_deviceIface;
  data_05.object.m_internal = local_320.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_320.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device._0_4_ = (int)local_320.deleter.m_device;
  data_05.deleter.m_device._4_4_ = (int)((ulong)local_320.deleter.m_device >> 0x20);
  data_05.deleter.m_allocator._0_4_ = (int)local_320.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_320.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::operator=
            (&this->m_pipelineLayout,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&colorAttachmentDescription.initialLayout);
  colorAttachmentReference.layout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttachmentDescription.flags = 1;
  colorAttachmentDescription.format = VK_FORMAT_R4G4_UNORM_PACK8;
  colorAttachmentDescription.samples = 0;
  colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_DONT_CARE;
  colorAttachmentDescription.storeOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
  colorAttachmentDescription.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  colorAttachmentDescription.stencilStoreOp = VK_ATTACHMENT_STORE_OP_LAST;
  depthAttachmentReference.attachment = 0;
  depthAttachmentReference.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  subpassDescription.pPreserveAttachments = (deUint32 *)0xffffffff;
  renderPassInfo.pDependencies._0_4_ = 0;
  renderPassInfo.pDependencies._4_4_ = 0;
  subpassDescription.flags = 0;
  subpassDescription.inputAttachmentCount = 0;
  subpassDescription._12_4_ = 0;
  subpassDescription.pInputAttachments._0_4_ = 1;
  subpassDescription._24_8_ = &depthAttachmentReference;
  subpassDescription.pColorAttachments = (VkAttachmentReference *)0x0;
  subpassDescription.pResolveAttachments =
       (VkAttachmentReference *)&subpassDescription.pPreserveAttachments;
  subpassDescription.pDepthStencilAttachment._0_4_ = 0;
  subpassDescription.preserveAttachmentCount = 0;
  subpassDescription._60_4_ = 0;
  local_400._0_4_ = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  renderPassInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassInfo._4_4_ = 0;
  renderPassInfo.pNext._0_4_ = 0;
  renderPassInfo.pNext._4_4_ = 1;
  renderPassInfo._16_8_ = &colorAttachmentReference.layout;
  renderPassInfo.pAttachments._0_4_ = 1;
  renderPassInfo._32_8_ = &renderPassInfo.pDependencies;
  renderPassInfo.pSubpasses._0_4_ = 0;
  renderPassInfo.dependencyCount = 0;
  renderPassInfo._52_4_ = 0;
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)attachmentBindInfos,vk_00,device_00,
             (VkRenderPassCreateInfo *)local_400,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_420,(Move *)attachmentBindInfos);
  data_06.deleter.m_deviceIface._0_4_ = (int)local_420.deleter.m_deviceIface;
  data_06.object.m_internal = local_420.object.m_internal;
  data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_420.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_device._0_4_ = (int)local_420.deleter.m_device;
  data_06.deleter.m_device._4_4_ = (int)((ulong)local_420.deleter.m_device >> 0x20);
  data_06.deleter.m_allocator._0_4_ = (int)local_420.deleter.m_allocator;
  data_06.deleter.m_allocator._4_4_ = (int)((ulong)local_420.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::operator=(&this->m_renderPass,data_06);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)17>_> *)attachmentBindInfos);
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::get
                      (&(this->m_colorImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  framebufferInfo._56_8_ = pHVar13->m_internal;
  local_488._0_4_ = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  framebufferInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  framebufferInfo._4_4_ = 0;
  framebufferInfo.pNext._0_4_ = 0;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  framebufferInfo._16_8_ = pHVar14->m_internal;
  framebufferInfo.renderPass.m_internal._0_4_ = 1;
  framebufferInfo._32_8_ = &framebufferInfo.layers;
  framebufferInfo.pAttachments._0_4_ =
       tcu::Vector<unsigned_int,_2>::x(&(this->super_DrawContext).m_drawState.renderSize);
  framebufferInfo.pAttachments._4_4_ =
       tcu::Vector<unsigned_int,_2>::y(&(this->super_DrawContext).m_drawState.renderSize);
  framebufferInfo.width = 1;
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&vertexFormat,vk_00,device_00,
             (VkFramebufferCreateInfo *)local_488,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_4a8,(Move *)&vertexFormat);
  data_07.deleter.m_deviceIface._0_4_ = (int)local_4a8.deleter.m_deviceIface;
  data_07.object.m_internal = local_4a8.object.m_internal;
  data_07.deleter.m_deviceIface._4_4_ = (int)((ulong)local_4a8.deleter.m_deviceIface >> 0x20);
  data_07.deleter.m_device._0_4_ = (int)local_4a8.deleter.m_device;
  data_07.deleter.m_device._4_4_ = (int)((ulong)local_4a8.deleter.m_device >> 0x20);
  data_07.deleter.m_allocator._0_4_ = (int)local_4a8.deleter.m_allocator;
  data_07.deleter.m_allocator._4_4_ = (int)((ulong)local_4a8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::operator=(&this->m_framebuffer,data_07);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&vertexFormat);
  bindingDesc.inputRate = 0x6d;
  local_4e0 = 0x1000000000;
  bindingDesc.binding = 0;
  vertexInputStateInfo.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  pipelineInputAssemblyStateInfo.primitiveRestartEnable = 0x13;
  vertexInputStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vertexInputStateInfo._4_4_ = 0;
  vertexInputStateInfo.pNext._0_4_ = 0;
  vertexInputStateInfo.pNext._4_4_ = 1;
  vertexInputStateInfo._16_8_ = &local_4e0;
  vertexInputStateInfo.pVertexBindingDescriptions._0_4_ = 1;
  vertexInputStateInfo._32_8_ = &vertexInputStateInfo.pVertexAttributeDescriptions;
  pipelineInputAssemblyStateInfo.flags = 0;
  pipelineInputAssemblyStateInfo.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  pipelineInputAssemblyStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineInputAssemblyStateInfo._4_4_ = 0;
  pipelineTessellationStateInfo.flags = 0x14;
  pipelineTessellationStateInfo.patchControlPoints = 0;
  pipelineInputAssemblyStateInfo.pNext =
       (void *)((ulong)(this->super_DrawContext).m_drawState.topology << 0x20);
  viewport.minDepth = 2.94273e-44;
  pipelineTessellationStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineTessellationStateInfo._4_4_ = 0;
  pipelineTessellationStateInfo.pNext._0_4_ = 0;
  pipelineTessellationStateInfo.pNext._4_4_ =
       (this->super_DrawContext).m_drawState.numPatchControlPoints;
  uVar3 = tcu::Vector<unsigned_int,_2>::x(&(this->super_DrawContext).m_drawState.renderSize);
  uVar4 = tcu::Vector<unsigned_int,_2>::y(&(this->super_DrawContext).m_drawState.renderSize);
  ::vk::makeViewport((VkViewport *)&scissor.extent,0.0,0.0,(float)uVar3,(float)uVar4,0.0,1.0);
  pipelineViewportStateInfo.pScissors = (VkRect2D *)::vk::makeOffset2D(0,0);
  uVar3 = tcu::Vector<unsigned_int,_2>::x(&(this->super_DrawContext).m_drawState.renderSize);
  uVar4 = tcu::Vector<unsigned_int,_2>::y(&(this->super_DrawContext).m_drawState.renderSize);
  scissor.offset = (VkOffset2D)::vk::makeExtent2D(uVar3,uVar4);
  pipelineRasterizationStateInfo.lineWidth = 3.08286e-44;
  pipelineViewportStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineViewportStateInfo._4_4_ = 0;
  pipelineViewportStateInfo.pNext._0_4_ = 0;
  pipelineViewportStateInfo.pNext._4_4_ = 1;
  pipelineViewportStateInfo._16_8_ = &scissor.extent;
  pipelineViewportStateInfo.pViewports._0_4_ = 1;
  pipelineViewportStateInfo._32_8_ = &pipelineViewportStateInfo.pScissors;
  pipelineMultisampleStateInfo.alphaToCoverageEnable = 0x17;
  pipelineRasterizationStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineRasterizationStateInfo._4_4_ = 0;
  pipelineRasterizationStateInfo.pNext._0_4_ = 0;
  pipelineRasterizationStateInfo.pNext._4_4_ =
       (this->super_DrawContext).m_drawState.depthClampEnable & 1;
  pipelineRasterizationStateInfo.flags = 0;
  pipelineRasterizationStateInfo.depthClampEnable = 0;
  pipelineRasterizationStateInfo.rasterizerDiscardEnable = 0;
  pipelineRasterizationStateInfo.polygonMode = VK_POLYGON_MODE_FILL;
  pipelineRasterizationStateInfo.cullMode = 0;
  pipelineRasterizationStateInfo.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  pipelineRasterizationStateInfo.depthBiasEnable = 0;
  pipelineRasterizationStateInfo.depthBiasConstantFactor = 0.0;
  pipelineRasterizationStateInfo.depthBiasClamp = (this->super_DrawContext).m_drawState.lineWidth;
  pipelineMultisampleStateInfo.sampleShadingEnable = 0;
  pipelineMultisampleStateInfo.minSampleShading = 0.0;
  pipelineMultisampleStateInfo.pSampleMask = (VkSampleMask *)0x0;
  pipelineMultisampleStateInfo.flags = 0;
  pipelineMultisampleStateInfo.rasterizationSamples = 0;
  pipelineMultisampleStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineMultisampleStateInfo._4_4_ = 0;
  stencilOpState.writeMask = 0x18;
  stencilOpState.reference = 0;
  pipelineMultisampleStateInfo.pNext = (void *)0x100000000;
  ::vk::makeStencilOpState
            ((VkStencilOpState *)&pipelineDepthStencilStateInfo.maxDepthBounds,VK_STENCIL_OP_KEEP,
             VK_STENCIL_OP_KEEP,VK_STENCIL_OP_KEEP,VK_COMPARE_OP_NEVER,0,0,0);
  pipelineColorBlendAttachmentState.colorWriteMask = 0x19;
  pipelineDepthStencilStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineDepthStencilStateInfo._4_4_ = 0;
  pipelineDepthStencilStateInfo.pNext._0_4_ = 0;
  pipelineDepthStencilStateInfo.pNext._4_4_ = 0;
  pipelineDepthStencilStateInfo.flags = 0;
  pipelineDepthStencilStateInfo.depthTestEnable = 1;
  pipelineDepthStencilStateInfo.depthWriteEnable = 0;
  pipelineDepthStencilStateInfo.depthCompareOp = VK_COMPARE_OP_NEVER;
  pipelineDepthStencilStateInfo.depthBoundsTestEnable =
       (VkBool32)pipelineDepthStencilStateInfo.maxDepthBounds;
  pipelineDepthStencilStateInfo.stencilTestEnable = dStack_640;
  pipelineDepthStencilStateInfo.front.failOp = stencilOpState.failOp;
  pipelineDepthStencilStateInfo.front.passOp = stencilOpState.passOp;
  pipelineDepthStencilStateInfo.front.depthFailOp = stencilOpState.depthFailOp;
  pipelineDepthStencilStateInfo.front.compareOp = stencilOpState.compareOp;
  pipelineDepthStencilStateInfo.front.compareMask = stencilOpState.compareMask;
  pipelineDepthStencilStateInfo.front.writeMask =
       (deUint32)pipelineDepthStencilStateInfo.maxDepthBounds;
  pipelineDepthStencilStateInfo.front.reference = dStack_640;
  pipelineDepthStencilStateInfo.back.failOp = stencilOpState.failOp;
  pipelineDepthStencilStateInfo.back.passOp = stencilOpState.passOp;
  pipelineDepthStencilStateInfo.back.depthFailOp = stencilOpState.depthFailOp;
  pipelineDepthStencilStateInfo.back.compareOp = stencilOpState.compareOp;
  pipelineDepthStencilStateInfo.back.compareMask = stencilOpState.compareMask;
  pipelineDepthStencilStateInfo.back.writeMask = 0;
  pipelineDepthStencilStateInfo.back.reference = 0x3f800000;
  pipelineColorBlendAttachmentState.alphaBlendOp = 0xf;
  pipelineColorBlendStateInfo.blendConstants[3] =
       (float)(uint)((this->super_DrawContext).m_drawState.blendEnable & 1);
  pipelineColorBlendAttachmentState.blendEnable = 1;
  pipelineColorBlendAttachmentState.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  pipelineColorBlendAttachmentState.dstColorBlendFactor = VK_BLEND_FACTOR_SRC_ALPHA;
  pipelineColorBlendAttachmentState.colorBlendOp = VK_BLEND_OP_SUBTRACT;
  pipelineColorBlendAttachmentState.srcAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  pipelineColorBlendAttachmentState.dstAlphaBlendFactor = VK_BLEND_FACTOR_SRC1_COLOR;
  shaderStages.
  super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x1a;
  pipelineColorBlendStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineColorBlendStateInfo._4_4_ = 0;
  pipelineColorBlendStateInfo.pNext._0_4_ = 0;
  pipelineColorBlendStateInfo.pNext._4_4_ = 0;
  pipelineColorBlendStateInfo.flags = 3;
  pipelineColorBlendStateInfo.logicOpEnable = 1;
  pipelineColorBlendStateInfo._24_8_ = pipelineColorBlendStateInfo.blendConstants + 3;
  pipelineColorBlendStateInfo.pAttachments._0_4_ = 0;
  pipelineColorBlendStateInfo.pAttachments._4_4_ = 0;
  pipelineColorBlendStateInfo.blendConstants[0] = 0.0;
  pipelineColorBlendStateInfo.blendConstants[1] = 0.0;
  std::
  vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  ::vector((vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
            *)&shaderNdx);
  local_72c = 0;
  local_730 = 0;
  while( true ) {
    uVar22 = (ulong)local_730;
    sVar12 = std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::size
                       ((this->m_program).shaders);
    if (sVar12 <= uVar22) break;
    pvVar15 = std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::operator[]
                        ((this->m_program).shaders,(ulong)local_730);
    ::vk::createShaderModule
              ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineShaderStageInfo.pSpecializationInfo
               ,vk_00,device_00,pvVar15->binary,0);
    ::vk::refdetails::Move::operator_cast_to_RefData
              (&local_750,(Move *)&pipelineShaderStageInfo.pSpecializationInfo);
    data_08.deleter.m_deviceIface._0_4_ = (int)local_750.deleter.m_deviceIface;
    data_08.object.m_internal = local_750.object.m_internal;
    data_08.deleter.m_deviceIface._4_4_ = (int)((ulong)local_750.deleter.m_deviceIface >> 0x20);
    data_08.deleter.m_device._0_4_ = (int)local_750.deleter.m_device;
    data_08.deleter.m_device._4_4_ = (int)((ulong)local_750.deleter.m_device >> 0x20);
    data_08.deleter.m_allocator._0_4_ = (int)local_750.deleter.m_allocator;
    data_08.deleter.m_allocator._4_4_ = (int)((ulong)local_750.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::operator=
              (this->m_shaderModules + local_730,data_08);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineShaderStageInfo.pSpecializationInfo
              );
    local_7a0._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
    pipelineShaderStageInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    pipelineShaderStageInfo._4_4_ = 0;
    pipelineShaderStageInfo.pNext._0_4_ = 0;
    pvVar15 = std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::operator[]
                        ((this->m_program).shaders,(ulong)local_730);
    pipelineShaderStageInfo.pNext._4_4_ = pvVar15->stage;
    pHVar16 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                        (&this->m_shaderModules[local_730].
                          super_RefBase<vk::Handle<(vk::HandleType)14>_>);
    pipelineShaderStageInfo._16_8_ = pHVar16->m_internal;
    pipelineShaderStageInfo.module.m_internal = (long)"pre_main" + 4;
    pipelineShaderStageInfo.pName = (char *)0x0;
    std::
    vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
    ::push_back((vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                 *)&shaderNdx,(value_type *)local_7a0);
    pvVar15 = std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::operator[]
                        ((this->m_program).shaders,(ulong)local_730);
    local_72c = pvVar15->stage | local_72c;
    local_730 = local_730 + 1;
  }
  graphicsPipelineInfo._143_1_ =
       (this->super_DrawContext).m_drawState.topology == VK_PRIMITIVE_TOPOLOGY_PATCH_LIST;
  local_838._0_4_ = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  graphicsPipelineInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  graphicsPipelineInfo._4_4_ = 0;
  graphicsPipelineInfo.pNext._0_4_ = 0;
  sVar12 = std::
           vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
           ::size((vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                   *)&shaderNdx);
  graphicsPipelineInfo.pNext._4_4_ = (undefined4)sVar12;
  graphicsPipelineInfo._16_8_ =
       std::
       vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
       ::operator[]((vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                     *)&shaderNdx,0);
  graphicsPipelineInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)&pipelineInputAssemblyStateInfo.primitiveRestartEnable;
  graphicsPipelineInfo.pVertexInputState =
       (VkPipelineVertexInputStateCreateInfo *)&pipelineTessellationStateInfo.flags;
  if ((graphicsPipelineInfo._143_1_ & 1) == 0) {
    local_ca8 = (VkPipelineInputAssemblyStateCreateInfo *)0x0;
  }
  else {
    local_ca8 = (VkPipelineInputAssemblyStateCreateInfo *)&viewport.minDepth;
  }
  graphicsPipelineInfo.pInputAssemblyState = local_ca8;
  graphicsPipelineInfo.pTessellationState =
       (VkPipelineTessellationStateCreateInfo *)&pipelineRasterizationStateInfo.lineWidth;
  graphicsPipelineInfo.pViewportState =
       (VkPipelineViewportStateCreateInfo *)&pipelineMultisampleStateInfo.alphaToCoverageEnable;
  graphicsPipelineInfo.pRasterizationState =
       (VkPipelineRasterizationStateCreateInfo *)&stencilOpState.writeMask;
  graphicsPipelineInfo.pMultisampleState =
       (VkPipelineMultisampleStateCreateInfo *)&pipelineColorBlendAttachmentState.colorWriteMask;
  graphicsPipelineInfo.pDepthStencilState =
       (VkPipelineDepthStencilStateCreateInfo *)
       &shaderStages.
        super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  graphicsPipelineInfo.pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)0x0;
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  graphicsPipelineInfo.pDynamicState = (VkPipelineDynamicStateCreateInfo *)pHVar17->m_internal;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  graphicsPipelineInfo.layout.m_internal = pHVar14->m_internal;
  graphicsPipelineInfo.renderPass.m_internal._0_4_ = 0;
  ::vk::Handle<(vk::HandleType)18>::Handle
            ((Handle<(vk::HandleType)18> *)&graphicsPipelineInfo.subpass,0);
  graphicsPipelineInfo.basePipelineHandle.m_internal._0_4_ = 0;
  ::vk::Handle<(vk::HandleType)15>::Handle((Handle<(vk::HandleType)15> *)&zeroOffset,0);
  ::vk::createGraphicsPipeline
            (&local_878,vk_00,device_00,(VkPipelineCache)zeroOffset,
             (VkGraphicsPipelineCreateInfo *)local_838,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_858,(Move *)&local_878);
  data_09.deleter.m_deviceIface._0_4_ = (int)local_858.deleter.m_deviceIface;
  data_09.object.m_internal = local_858.object.m_internal;
  data_09.deleter.m_deviceIface._4_4_ = (int)((ulong)local_858.deleter.m_deviceIface >> 0x20);
  data_09.deleter.m_device._0_4_ = (int)local_858.deleter.m_device;
  data_09.deleter.m_device._4_4_ = (int)((ulong)local_858.deleter.m_device >> 0x20);
  data_09.deleter.m_allocator._0_4_ = (int)local_858.deleter.m_allocator;
  data_09.deleter.m_allocator._4_4_ = (int)((ulong)local_858.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::operator=(&this->m_pipeline,data_09);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_878);
  std::
  vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  ::~vector((vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
             *)&shaderNdx);
  clearValue._8_8_ = 0;
  ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  beginCommandBuffer(vk_00,*ppVVar18);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&renderArea.extent,0.0,0.0,0.0,1.0);
  VVar24 = ::vk::makeClearValueColor((Vec4 *)&renderArea.extent);
  clearValue.depthStencil = (VkClearDepthStencilValue)VVar24._8_8_;
  local_898 = VVar24.depthStencil;
  renderPassBeginInfo.pClearValues = (VkClearValue *)::vk::makeOffset2D(0,0);
  uVar3 = tcu::Vector<unsigned_int,_2>::x(&(this->super_DrawContext).m_drawState.renderSize);
  uVar4 = tcu::Vector<unsigned_int,_2>::y(&(this->super_DrawContext).m_drawState.renderSize);
  renderArea.offset = (VkOffset2D)::vk::makeExtent2D(uVar3,uVar4);
  local_8f8[0] = 0x2b;
  renderPassBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassBeginInfo._4_4_ = 0;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  renderPassBeginInfo.pNext = (void *)pHVar14->m_internal;
  pHVar19 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                      (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  renderPassBeginInfo.renderPass.m_internal = pHVar19->m_internal;
  renderPassBeginInfo.framebuffer.m_internal = (deUint64)renderPassBeginInfo.pClearValues;
  renderPassBeginInfo.renderArea.offset = renderArea.offset;
  renderPassBeginInfo.renderArea.extent.width = 1;
  renderPassBeginInfo._48_8_ = &local_898;
  ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vk_00->_vptr_DeviceInterface[0x74])(vk_00,*ppVVar18,local_8f8,0);
  ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar1 = *ppVVar18;
  pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      (&(this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  barrier._64_8_ = pHVar20->m_internal;
  (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar1,0,barrier._64_8_);
  ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar1 = *ppVVar18;
  pBVar9 = de::details::UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>
           ::operator*(&(this->m_vertexBuffer).
                        super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>
                      );
  pVVar21 = ::vk::BufferWithMemory::operator*(pBVar9);
  (*vk_00->_vptr_DeviceInterface[0x58])(vk_00,pVVar1,0,1,pVVar21,(long)&clearValue + 8);
  ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar1 = *ppVVar18;
  sVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                     ((this->super_DrawContext).m_drawCallData.vertices);
  (*vk_00->_vptr_DeviceInterface[0x59])(vk_00,pVVar1,sVar12 & 0xffffffff,1,0);
  ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vk_00->_vptr_DeviceInterface[0x76])(vk_00,*ppVVar18);
  pIVar7 = de::details::UniqueBase<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_>::
           operator*(&(this->m_colorImage).
                      super_UniqueBase<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_>
                    );
  pVVar8 = ::vk::ImageWithMemory::operator*(pIVar7);
  copyRegion.imageExtent.height = (undefined4)VStack_78;
  copyRegion.imageExtent.depth = VStack_78._4_4_;
  subresourceRange_00.levelCount = colorSubresourceRange.aspectMask;
  subresourceRange_00.aspectMask = (undefined4)VStack_78;
  subresourceRange_00.baseMipLevel = VStack_78._4_4_;
  subresourceRange_00.baseArrayLayer = colorSubresourceRange.baseMipLevel;
  subresourceRange_00.layerCount = colorSubresourceRange.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_948,0x100,0x800,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,(VkImage)pVVar8->m_internal,subresourceRange_00);
  ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vk_00->_vptr_DeviceInterface[0x6d])
            (vk_00,*ppVVar18,0x400,0x1000,0,0,0,0,0,1,(VkImageMemoryBarrier *)local_948);
  subresourceLayers = ::vk::makeImageSubresourceLayers(1,0,0,1);
  uVar3 = tcu::Vector<unsigned_int,_2>::x(&(this->super_DrawContext).m_drawState.renderSize);
  uVar4 = tcu::Vector<unsigned_int,_2>::y(&(this->super_DrawContext).m_drawState.renderSize);
  VVar23 = ::vk::makeExtent3D(uVar3,uVar4,1);
  makeBufferImageCopy((VkBufferImageCopy *)local_9a0,subresourceLayers,VVar23);
  ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar1 = *ppVVar18;
  pIVar7 = de::details::UniqueBase<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_>::
           operator*(&(this->m_colorImage).
                      super_UniqueBase<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_>
                    );
  pVVar8 = ::vk::ImageWithMemory::operator*(pIVar7);
  dVar2 = pVVar8->m_internal;
  pBVar9 = de::details::UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>
           ::operator*(&(this->m_colorAttachmentBuffer).
                        super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>
                      );
  pVVar21 = ::vk::BufferWithMemory::operator*(pBVar9);
  barrier_1.size = pVVar21->m_internal;
  (*vk_00->_vptr_DeviceInterface[99])(vk_00,pVVar1,dVar2,6,barrier_1.size,1,(int)local_9a0);
  pBVar9 = de::details::UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>
           ::operator*(&(this->m_colorAttachmentBuffer).
                        super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>
                      );
  pVVar21 = ::vk::BufferWithMemory::operator*(pBVar9);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_a28,0x1000,0x2000,(VkBuffer)pVVar21->m_internal,0,
             0xffffffffffffffff);
  ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vk_00->_vptr_DeviceInterface[0x6d])
            (vk_00,*ppVVar18,0x1000,0x4000,0,0,0,1,(int)(VkBufferMemoryBarrier *)local_a28,0,0);
  ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  endCommandBuffer(vk_00,*ppVVar18);
  return;
}

Assistant:

VulkanDrawContext::VulkanDrawContext (  Context&				context,
										const DrawState&		drawState,
										const DrawCallData&		drawCallData,
										const VulkanProgram&	vulkanProgram)
	: DrawContext						(drawState, drawCallData)
	, m_context							(context)
	, m_program							(vulkanProgram)
{
	const DeviceInterface&	vk						= m_context.getDeviceInterface();
	const VkDevice			device					= m_context.getDevice();
	Allocator&				allocator				= m_context.getDefaultAllocator();
	VkImageSubresourceRange	colorSubresourceRange;

	// Command buffer
	{
		m_cmdPool			= makeCommandPool(vk, device, m_context.getUniversalQueueFamilyIndex());
		m_cmdBuffer			= makeCommandBuffer(vk, device, *m_cmdPool);
	}

	// Color attachment image
	{
		const VkImageUsageFlags usage			= VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT;
		colorSubresourceRange					= makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
		const VkImageCreateInfo	imageCreateInfo	=
		{
			VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,										// VkStructureType			sType;
			DE_NULL,																	// const void*				pNext;
			(VkImageCreateFlags)0,														// VkImageCreateFlags		flags;
			VK_IMAGE_TYPE_2D,															// VkImageType				imageType;
			m_drawState.colorFormat,													// VkFormat					format;
			makeExtent3D(m_drawState.renderSize.x(), m_drawState.renderSize.y(), 1u),	// VkExtent3D				extent;
			1u,																			// uint32_t					mipLevels;
			1u,																			// uint32_t					arrayLayers;
			VK_SAMPLE_COUNT_1_BIT,														// VkSampleCountFlagBits	samples;
			VK_IMAGE_TILING_OPTIMAL,													// VkImageTiling			tiling;
			usage,																		// VkImageUsageFlags		usage;
			VK_SHARING_MODE_EXCLUSIVE,													// VkSharingMode			sharingMode;
			VK_QUEUE_FAMILY_IGNORED,													// uint32_t					queueFamilyIndexCount;
			DE_NULL,																	// const uint32_t*			pQueueFamilyIndices;
			VK_IMAGE_LAYOUT_UNDEFINED,													// VkImageLayout			initialLayout;
		};

		m_colorImage = MovePtr<ImageWithMemory>(new ImageWithMemory(vk, device, allocator, imageCreateInfo, MemoryRequirement::Any));
		m_colorImageView = makeImageView(vk, device, **m_colorImage, VK_IMAGE_VIEW_TYPE_2D, m_drawState.colorFormat, colorSubresourceRange);

		// Buffer to copy attachment data after rendering

		const VkDeviceSize bitmapSize = tcu::getPixelSize(mapVkFormat(m_drawState.colorFormat)) * m_drawState.renderSize.x() * m_drawState.renderSize.y();
		m_colorAttachmentBuffer = MovePtr<BufferWithMemory>(new BufferWithMemory(
			vk, device, allocator, makeBufferCreateInfo(bitmapSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible));

		{
			const Allocation& alloc = m_colorAttachmentBuffer->getAllocation();
			deMemset(alloc.getHostPtr(), 0, (size_t)bitmapSize);
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), bitmapSize);
		}
	}

	// Vertex buffer
	{
		const VkDeviceSize bufferSize = m_drawCallData.vertices.size() * sizeof(m_drawCallData.vertices[0]);
		m_vertexBuffer = MovePtr<BufferWithMemory>(new BufferWithMemory(
			vk, device, allocator, makeBufferCreateInfo(bufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible));

		const Allocation& alloc = m_vertexBuffer->getAllocation();
		deMemcpy(alloc.getHostPtr(), &m_drawCallData.vertices[0], (size_t)bufferSize);
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), bufferSize);
	}

	// Pipeline layout
	{
		m_pipelineLayout = makePipelineLayoutWithoutDescriptors(vk, device);
	}

	// Renderpass
	{
		const VkAttachmentDescription colorAttachmentDescription =
		{
			(VkAttachmentDescriptionFlags)0,					// VkAttachmentDescriptionFlags		flags;
			m_drawState.colorFormat,							// VkFormat							format;
			VK_SAMPLE_COUNT_1_BIT,								// VkSampleCountFlagBits			samples;
			VK_ATTACHMENT_LOAD_OP_CLEAR,						// VkAttachmentLoadOp				loadOp;
			VK_ATTACHMENT_STORE_OP_STORE,						// VkAttachmentStoreOp				storeOp;
			VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				stencilLoadOp;
			VK_ATTACHMENT_STORE_OP_DONT_CARE,					// VkAttachmentStoreOp				stencilStoreOp;
			VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout					initialLayout;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,			// VkImageLayout					finalLayout;
		};

		const VkAttachmentReference colorAttachmentReference =
		{
			0u,													// deUint32			attachment;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL			// VkImageLayout	layout;
		};

		const VkAttachmentReference depthAttachmentReference =
		{
			VK_ATTACHMENT_UNUSED,								// deUint32			attachment;
			VK_IMAGE_LAYOUT_UNDEFINED							// VkImageLayout	layout;
		};

		const VkSubpassDescription subpassDescription =
		{
			(VkSubpassDescriptionFlags)0,						// VkSubpassDescriptionFlags		flags;
			VK_PIPELINE_BIND_POINT_GRAPHICS,					// VkPipelineBindPoint				pipelineBindPoint;
			0u,													// deUint32							inputAttachmentCount;
			DE_NULL,											// const VkAttachmentReference*		pInputAttachments;
			1u,													// deUint32							colorAttachmentCount;
			&colorAttachmentReference,							// const VkAttachmentReference*		pColorAttachments;
			DE_NULL,											// const VkAttachmentReference*		pResolveAttachments;
			&depthAttachmentReference,							// const VkAttachmentReference*		pDepthStencilAttachment;
			0u,													// deUint32							preserveAttachmentCount;
			DE_NULL												// const deUint32*					pPreserveAttachments;
		};

		const VkRenderPassCreateInfo renderPassInfo =
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,			// VkStructureType					sType;
			DE_NULL,											// const void*						pNext;
			(VkRenderPassCreateFlags)0,							// VkRenderPassCreateFlags			flags;
			1u,													// deUint32							attachmentCount;
			&colorAttachmentDescription,						// const VkAttachmentDescription*	pAttachments;
			1u,													// deUint32							subpassCount;
			&subpassDescription,								// const VkSubpassDescription*		pSubpasses;
			0u,													// deUint32							dependencyCount;
			DE_NULL												// const VkSubpassDependency*		pDependencies;
		};

		m_renderPass = createRenderPass(vk, device, &renderPassInfo);
	}

	// Framebuffer
	{
		const VkImageView attachmentBindInfos[] =
		{
			m_colorImageView.get()
		};

		const VkFramebufferCreateInfo framebufferInfo = {
			VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,		// VkStructureType						sType;
			DE_NULL,										// const void*							pNext;
			(VkFramebufferCreateFlags)0,					// VkFramebufferCreateFlags				flags;
			*m_renderPass,									// VkRenderPass							renderPass;
			DE_LENGTH_OF_ARRAY(attachmentBindInfos),		// uint32_t								attachmentCount;
			attachmentBindInfos,							// const VkImageView*					pAttachments;
			m_drawState.renderSize.x(),						// uint32_t								width;
			m_drawState.renderSize.y(),						// uint32_t								height;
			1u,												// uint32_t								layers;
		};

		m_framebuffer = createFramebuffer(vk, device, &framebufferInfo);
	}

	// Graphics pipeline
	{
		const deUint32	vertexStride	= sizeof(Vec4);
		const VkFormat	vertexFormat	= VK_FORMAT_R32G32B32A32_SFLOAT;

		DE_ASSERT(m_drawState.topology != VK_PRIMITIVE_TOPOLOGY_PATCH_LIST || m_drawState.numPatchControlPoints > 0);

		const VkVertexInputBindingDescription bindingDesc =
		{
			0u,									// uint32_t				binding;
			vertexStride,						// uint32_t				stride;
			VK_VERTEX_INPUT_RATE_VERTEX,		// VkVertexInputRate	inputRate;
		};
		const VkVertexInputAttributeDescription attributeDesc =
		{
			0u,									// uint32_t			location;
			0u,									// uint32_t			binding;
			vertexFormat,						// VkFormat			format;
			0u,									// uint32_t			offset;
		};

		const VkPipelineVertexInputStateCreateInfo vertexInputStateInfo =
		{
			VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,		// VkStructureType								sType;
			DE_NULL,														// const void*									pNext;
			(VkPipelineVertexInputStateCreateFlags)0,						// VkPipelineVertexInputStateCreateFlags		flags;
			1u,																// uint32_t										vertexBindingDescriptionCount;
			&bindingDesc,													// const VkVertexInputBindingDescription*		pVertexBindingDescriptions;
			1u,																// uint32_t										vertexAttributeDescriptionCount;
			&attributeDesc,													// const VkVertexInputAttributeDescription*		pVertexAttributeDescriptions;
		};

		const VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo =
		{
			VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,	// VkStructureType								sType;
			DE_NULL,														// const void*									pNext;
			(VkPipelineInputAssemblyStateCreateFlags)0,						// VkPipelineInputAssemblyStateCreateFlags		flags;
			m_drawState.topology,											// VkPrimitiveTopology							topology;
			VK_FALSE,														// VkBool32										primitiveRestartEnable;
		};

		const VkPipelineTessellationStateCreateInfo pipelineTessellationStateInfo =
		{
			VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO,		// VkStructureType								sType;
			DE_NULL,														// const void*									pNext;
			(VkPipelineTessellationStateCreateFlags)0,						// VkPipelineTessellationStateCreateFlags		flags;
			m_drawState.numPatchControlPoints,								// uint32_t										patchControlPoints;
		};

		const VkViewport viewport = makeViewport(
			0.0f, 0.0f,
			static_cast<float>(m_drawState.renderSize.x()), static_cast<float>(m_drawState.renderSize.y()),
			0.0f, 1.0f);

		const VkRect2D scissor = {
			makeOffset2D(0, 0),
			makeExtent2D(m_drawState.renderSize.x(), m_drawState.renderSize.y()),
		};

		const VkPipelineViewportStateCreateInfo pipelineViewportStateInfo =
		{
			VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,	// VkStructureType									sType;
			DE_NULL,												// const void*										pNext;
			(VkPipelineViewportStateCreateFlags)0,					// VkPipelineViewportStateCreateFlags				flags;
			1u,														// uint32_t											viewportCount;
			&viewport,												// const VkViewport*								pViewports;
			1u,														// uint32_t											scissorCount;
			&scissor,												// const VkRect2D*									pScissors;
		};

		const VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo =
		{
			VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,		// VkStructureType							sType;
			DE_NULL,														// const void*								pNext;
			(VkPipelineRasterizationStateCreateFlags)0,						// VkPipelineRasterizationStateCreateFlags	flags;
			m_drawState.depthClampEnable,									// VkBool32									depthClampEnable;
			VK_FALSE,														// VkBool32									rasterizerDiscardEnable;
			VK_POLYGON_MODE_FILL,											// VkPolygonMode							polygonMode;
			VK_CULL_MODE_NONE,												// VkCullModeFlags							cullMode;
			VK_FRONT_FACE_COUNTER_CLOCKWISE,								// VkFrontFace								frontFace;
			VK_FALSE,														// VkBool32									depthBiasEnable;
			0.0f,															// float									depthBiasConstantFactor;
			0.0f,															// float									depthBiasClamp;
			0.0f,															// float									depthBiasSlopeFactor;
			m_drawState.lineWidth,											// float									lineWidth;
		};

		const VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo =
		{
			VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,	// VkStructureType							sType;
			DE_NULL,													// const void*								pNext;
			(VkPipelineMultisampleStateCreateFlags)0,					// VkPipelineMultisampleStateCreateFlags	flags;
			VK_SAMPLE_COUNT_1_BIT,										// VkSampleCountFlagBits					rasterizationSamples;
			VK_FALSE,													// VkBool32									sampleShadingEnable;
			0.0f,														// float									minSampleShading;
			DE_NULL,													// const VkSampleMask*						pSampleMask;
			VK_FALSE,													// VkBool32									alphaToCoverageEnable;
			VK_FALSE													// VkBool32									alphaToOneEnable;
		};

		const VkStencilOpState stencilOpState = makeStencilOpState(
			VK_STENCIL_OP_KEEP,		// stencil fail
			VK_STENCIL_OP_KEEP,		// depth & stencil pass
			VK_STENCIL_OP_KEEP,		// depth only fail
			VK_COMPARE_OP_NEVER,	// compare op
			0u,						// compare mask
			0u,						// write mask
			0u);					// reference

		const VkPipelineDepthStencilStateCreateInfo pipelineDepthStencilStateInfo =
		{
			VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO,	// VkStructureType							sType;
			DE_NULL,													// const void*								pNext;
			(VkPipelineDepthStencilStateCreateFlags)0,					// VkPipelineDepthStencilStateCreateFlags	flags;
			VK_FALSE,													// VkBool32									depthTestEnable;
			VK_FALSE,													// VkBool32									depthWriteEnable;
			VK_COMPARE_OP_LESS,											// VkCompareOp								depthCompareOp;
			VK_FALSE,													// VkBool32									depthBoundsTestEnable;
			VK_FALSE,													// VkBool32									stencilTestEnable;
			stencilOpState,												// VkStencilOpState							front;
			stencilOpState,												// VkStencilOpState							back;
			0.0f,														// float									minDepthBounds;
			1.0f,														// float									maxDepthBounds;
		};

		const VkColorComponentFlags colorComponentsAll = VK_COLOR_COMPONENT_R_BIT | VK_COLOR_COMPONENT_G_BIT | VK_COLOR_COMPONENT_B_BIT | VK_COLOR_COMPONENT_A_BIT;
		const VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState =
		{
			m_drawState.blendEnable,			// VkBool32					blendEnable;
			VK_BLEND_FACTOR_SRC_ALPHA,			// VkBlendFactor			srcColorBlendFactor;
			VK_BLEND_FACTOR_ONE,				// VkBlendFactor			dstColorBlendFactor;
			VK_BLEND_OP_ADD,					// VkBlendOp				colorBlendOp;
			VK_BLEND_FACTOR_SRC_ALPHA,			// VkBlendFactor			srcAlphaBlendFactor;
			VK_BLEND_FACTOR_ONE,				// VkBlendFactor			dstAlphaBlendFactor;
			VK_BLEND_OP_ADD,					// VkBlendOp				alphaBlendOp;
			colorComponentsAll,					// VkColorComponentFlags	colorWriteMask;
		};

		const VkPipelineColorBlendStateCreateInfo pipelineColorBlendStateInfo =
		{
			VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,	// VkStructureType								sType;
			DE_NULL,													// const void*									pNext;
			(VkPipelineColorBlendStateCreateFlags)0,					// VkPipelineColorBlendStateCreateFlags			flags;
			VK_FALSE,													// VkBool32										logicOpEnable;
			VK_LOGIC_OP_COPY,											// VkLogicOp									logicOp;
			1u,															// deUint32										attachmentCount;
			&pipelineColorBlendAttachmentState,							// const VkPipelineColorBlendAttachmentState*	pAttachments;
			{ 0.0f, 0.0f, 0.0f, 0.0f },									// float										blendConstants[4];
		};

		// Create shader stages

		std::vector<VkPipelineShaderStageCreateInfo>	shaderStages;
		VkShaderStageFlags								stageFlags = (VkShaderStageFlags)0;

		DE_ASSERT(m_program.shaders.size() <= MAX_NUM_SHADER_MODULES);
		for (deUint32 shaderNdx = 0; shaderNdx < m_program.shaders.size(); ++shaderNdx)
		{
			m_shaderModules[shaderNdx] = createShaderModule(vk, device, *m_program.shaders[shaderNdx].binary, (VkShaderModuleCreateFlags)0);

			const VkPipelineShaderStageCreateInfo pipelineShaderStageInfo =
			{
				VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// VkStructureType						sType;
				DE_NULL,												// const void*							pNext;
				(VkPipelineShaderStageCreateFlags)0,					// VkPipelineShaderStageCreateFlags		flags;
				m_program.shaders[shaderNdx].stage,						// VkShaderStageFlagBits				stage;
				*m_shaderModules[shaderNdx],							// VkShaderModule						module;
				"main",													// const char*							pName;
				DE_NULL,												// const VkSpecializationInfo*			pSpecializationInfo;
			};

			shaderStages.push_back(pipelineShaderStageInfo);
			stageFlags |= m_program.shaders[shaderNdx].stage;
		}

		DE_ASSERT(
			(m_drawState.topology != VK_PRIMITIVE_TOPOLOGY_PATCH_LIST) ||
			(stageFlags & (VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT | VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)));

		const bool tessellationEnabled = (m_drawState.topology == VK_PRIMITIVE_TOPOLOGY_PATCH_LIST);
		const VkGraphicsPipelineCreateInfo graphicsPipelineInfo =
		{
			VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,						// VkStructureType									sType;
			DE_NULL,																// const void*										pNext;
			(VkPipelineCreateFlags)0,												// VkPipelineCreateFlags							flags;
			static_cast<deUint32>(shaderStages.size()),								// deUint32											stageCount;
			&shaderStages[0],														// const VkPipelineShaderStageCreateInfo*			pStages;
			&vertexInputStateInfo,													// const VkPipelineVertexInputStateCreateInfo*		pVertexInputState;
			&pipelineInputAssemblyStateInfo,										// const VkPipelineInputAssemblyStateCreateInfo*	pInputAssemblyState;
			(tessellationEnabled ? &pipelineTessellationStateInfo : DE_NULL),		// const VkPipelineTessellationStateCreateInfo*		pTessellationState;
			&pipelineViewportStateInfo,												// const VkPipelineViewportStateCreateInfo*			pViewportState;
			&pipelineRasterizationStateInfo,										// const VkPipelineRasterizationStateCreateInfo*	pRasterizationState;
			&pipelineMultisampleStateInfo,											// const VkPipelineMultisampleStateCreateInfo*		pMultisampleState;
			&pipelineDepthStencilStateInfo,											// const VkPipelineDepthStencilStateCreateInfo*		pDepthStencilState;
			&pipelineColorBlendStateInfo,											// const VkPipelineColorBlendStateCreateInfo*		pColorBlendState;
			DE_NULL,																// const VkPipelineDynamicStateCreateInfo*			pDynamicState;
			*m_pipelineLayout,														// VkPipelineLayout									layout;
			*m_renderPass,															// VkRenderPass										renderPass;
			0u,																		// deUint32											subpass;
			DE_NULL,																// VkPipeline										basePipelineHandle;
			0,																		// deInt32											basePipelineIndex;
		};

		m_pipeline = createGraphicsPipeline(vk, device, DE_NULL, &graphicsPipelineInfo);
	}

	// Record commands
	{
		const VkDeviceSize zeroOffset = 0ull;

		beginCommandBuffer(vk, *m_cmdBuffer);

		// Begin render pass
		{
			const VkClearValue	clearValue = makeClearValueColor(Vec4(0.0f, 0.0f, 0.0f, 1.0f));
			const VkRect2D		renderArea =
			{
				makeOffset2D(0, 0),
				makeExtent2D(m_drawState.renderSize.x(), m_drawState.renderSize.y())
			};

			const VkRenderPassBeginInfo renderPassBeginInfo = {
				VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,							// VkStructureType								sType;
				DE_NULL,															// const void*									pNext;
				*m_renderPass,														// VkRenderPass									renderPass;
				*m_framebuffer,														// VkFramebuffer								framebuffer;
				renderArea,															// VkRect2D										renderArea;
				1u,																	// uint32_t										clearValueCount;
				&clearValue,														// const VkClearValue*							pClearValues;
			};

			vk.cmdBeginRenderPass(*m_cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);
		}

		vk.cmdBindPipeline(*m_cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);
		vk.cmdBindVertexBuffers(*m_cmdBuffer, 0u, 1u, &(**m_vertexBuffer), &zeroOffset);

		vk.cmdDraw(*m_cmdBuffer, static_cast<deUint32>(m_drawCallData.vertices.size()), 1u, 0u, 0u);
		vk.cmdEndRenderPass(*m_cmdBuffer);

		// Barrier: draw -> copy from image
		{
			const VkImageMemoryBarrier barrier = makeImageMemoryBarrier(
				VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
				VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
				**m_colorImage, colorSubresourceRange);

			vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0,
				0u, DE_NULL, 0u, DE_NULL, 1u, &barrier);
		}

		{
			const VkBufferImageCopy copyRegion = makeBufferImageCopy(makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u),
					makeExtent3D(m_drawState.renderSize.x(), m_drawState.renderSize.y(), 1u));
			vk.cmdCopyImageToBuffer(*m_cmdBuffer, **m_colorImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, **m_colorAttachmentBuffer, 1u, &copyRegion);
		}

		// Barrier: copy to buffer -> host read
		{
			const VkBufferMemoryBarrier barrier = makeBufferMemoryBarrier(
				VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT,
				**m_colorAttachmentBuffer, 0ull, VK_WHOLE_SIZE);

			vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0,
				0u, DE_NULL, 1u, &barrier, 0u, DE_NULL);
		}

		endCommandBuffer(vk, *m_cmdBuffer);
	}
}